

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.h
# Opt level: O2

void __thiscall gnilk::IPCTestResults::IPCTestResults(IPCTestResults *this,Ref *useTestResult)

{
  (this->super_IPCSerializer)._vptr_IPCSerializer = (_func_int **)&PTR__IPCTestResults_0023d080;
  (this->super_IPCDeserializer).super_IPCObject._vptr_IPCObject =
       (_func_int **)&PTR__IPCTestResults_0023d0b8;
  (this->symbolName)._M_dataplus._M_p = (pointer)&(this->symbolName).field_2;
  (this->symbolName)._M_string_length = 0;
  (this->symbolName).field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>,
             &useTestResult->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>);
  (this->assertError)._vptr_AssertError = (_func_int **)&PTR__AssertError_0023c770;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertError).assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IPCTestResults(const trun::TestResult::Ref &useTestResult) : testResult(useTestResult) {}